

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_Qn_vector
          (singleParticleSpectra *this,int event_id,double pT_min_selected,double pT_max_selected,
          vector<double,_std::allocator<double>_> *event_pT_mean,
          vector<double,_std::allocator<double>_> *event_pT_mean_err,
          vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_real_err,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *event_Qn_imag_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag_err)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double in_XMM1_Qa;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000018;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000020;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000028;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000030;
  double sin_nphi_1;
  double cos_nphi_1;
  int iorder_1;
  int p_idx;
  double sin_nphi;
  double cos_nphi;
  int iorder;
  double p_phi;
  double p_perp;
  double py_local;
  double px_local;
  double pmag;
  double rap_local;
  double mass;
  double E_local;
  double pz_local;
  int i_2;
  int number_of_particles;
  int j;
  int i_1;
  int i;
  int in_stack_fffffffffffffc3c;
  particleSamples *in_stack_fffffffffffffc40;
  particleSamples *ppVar9;
  particleSamples *in_stack_fffffffffffffc48;
  particleSamples *in_stack_fffffffffffffc50;
  int local_318;
  int local_2fc;
  double local_2c8;
  double local_250;
  double local_1e0;
  double local_1d0;
  double local_128;
  double local_b0;
  int local_54;
  int local_4c;
  int local_48;
  int local_44;
  
  for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x1d0); local_44 = local_44 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_44);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_44);
    *pvVar3 = 0.0;
  }
  for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x1c8); local_48 = local_48 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_48);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,(long)local_48);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000008,(long)local_48);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000010,(long)local_48);
    *pvVar3 = 0.0;
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x1d0); local_4c = local_4c + 1) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000018,(long)local_48);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_4c);
      *pvVar3 = 0.0;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000020,(long)local_48);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_4c);
      *pvVar3 = 0.0;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000028,(long)local_48);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_4c);
      *pvVar3 = 0.0;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_stack_00000030,(long)local_48);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_4c);
      *pvVar3 = 0.0;
    }
  }
  std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x166960);
  iVar1 = particleSamples::get_number_of_particles
                    (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1669a6);
    particleSamples::get_particle
              (in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
               (int)in_stack_fffffffffffffc48);
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1669e7);
    particleSamples::get_particle
              (in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
               (int)in_stack_fffffffffffffc48);
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x166a28);
    particleSamples::get_particle
              (in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
               (int)in_stack_fffffffffffffc48);
    if (*(int *)(in_RDI + 0x238) == 0) {
      dVar5 = sqrt(local_128 * local_128 + -(local_1d0 * local_1d0));
      local_1e0 = log((dVar5 + local_b0) / (dVar5 - local_b0));
    }
    else {
      local_1e0 = log((local_128 + local_b0) / (local_128 - local_b0));
    }
    local_1e0 = local_1e0 * 0.5;
    if ((*(double *)(in_RDI + 0x240) <= local_1e0 && local_1e0 != *(double *)(in_RDI + 0x240)) &&
       (local_1e0 < *(double *)(in_RDI + 0x248))) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x166b9d);
      particleSamples::get_particle
                (in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                 (int)in_stack_fffffffffffffc48);
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x166bde);
      particleSamples::get_particle
                (in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                 (int)in_stack_fffffffffffffc48);
      dVar5 = sqrt(local_250 * local_250 + local_2c8 * local_2c8);
      dVar6 = atan2(local_2c8,local_250);
      if ((in_XMM0_Qa < dVar5) && (dVar5 < in_XMM1_Qa)) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,0);
        *pvVar3 = *pvVar3 + 1.0;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,0);
        *pvVar3 = *pvVar3 + 1.0;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000008,0);
        *pvVar3 = dVar5 + *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,0);
        *pvVar3 = dVar5 * dVar5 + *pvVar3;
        for (local_2fc = 1; local_2fc < *(int *)(in_RDI + 0x1c8); local_2fc = local_2fc + 1) {
          dVar7 = cos((double)local_2fc * dVar6);
          dVar8 = sin((double)local_2fc * dVar6);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_2fc);
          *pvVar3 = dVar7 + *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_stack_00000008,(long)local_2fc);
          *pvVar3 = dVar8 + *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,(long)local_2fc);
          *pvVar3 = dVar7 * dVar7 + *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_stack_00000010,(long)local_2fc);
          *pvVar3 = dVar8 * dVar8 + *pvVar3;
        }
        if (((*(double *)(in_RDI + 0x1d8) <= dVar5) &&
            (iVar2 = (int)((dVar5 - *(double *)(in_RDI + 0x1d8)) / *(double *)(in_RDI + 0x1e8)),
            -1 < iVar2)) && (iVar2 < *(int *)(in_RDI + 0x1d0))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)iVar2);
          *pvVar3 = dVar5 + *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)iVar2);
          *pvVar3 = dVar5 * dVar5 + *pvVar3;
          for (local_318 = 0; local_318 < *(int *)(in_RDI + 0x1c8); local_318 = local_318 + 1) {
            in_stack_fffffffffffffc48 = (particleSamples *)cos((double)local_318 * dVar6);
            dVar5 = sin((double)local_318 * dVar6);
            ppVar9 = in_stack_fffffffffffffc48;
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_stack_00000018,(long)local_318);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)iVar2);
            *pvVar3 = (double)ppVar9 + *pvVar3;
            in_stack_fffffffffffffc50 = in_stack_fffffffffffffc48;
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_stack_00000020,(long)local_318);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)iVar2);
            *pvVar3 = (double)in_stack_fffffffffffffc48 * (double)in_stack_fffffffffffffc50 +
                      *pvVar3;
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_stack_00000028,(long)local_318);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)iVar2);
            *pvVar3 = dVar5 + *pvVar3;
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_stack_00000030,(long)local_318);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)iVar2);
            *pvVar3 = dVar5 * dVar5 + *pvVar3;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_Qn_vector(
    int event_id, double pT_min_selected, double pT_max_selected,
    vector<double> &event_pT_mean, vector<double> &event_pT_mean_err,
    vector<double> &event_Qn_real, vector<double> &event_Qn_real_err,
    vector<double> &event_Qn_imag, vector<double> &event_Qn_imag_err,
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_real_err,
    vector<vector<double>> &event_Qn_diff_imag,
    vector<vector<double>> &event_Qn_diff_imag_err) {
    // first clean the results arrays
    for (int i = 0; i < npT; i++) {
        event_pT_mean[i] = 0.0;
        event_pT_mean_err[i] = 0.0;
    }
    for (int i = 0; i < order_max; i++) {
        event_Qn_real[i] = 0.0;
        event_Qn_real_err[i] = 0.0;
        event_Qn_imag[i] = 0.0;
        event_Qn_imag_err[i] = 0.0;
        for (int j = 0; j < npT; j++) {
            event_Qn_diff_real[i][j] = 0.0;
            event_Qn_diff_real_err[i][j] = 0.0;
            event_Qn_diff_imag[i][j] = 0.0;
            event_Qn_diff_imag_err[i][j] = 0.0;
        }
    }

    int number_of_particles = particle_list->get_number_of_particles(event_id);
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = particle_list->get_particle(event_id, i).pz;
        double E_local = particle_list->get_particle(event_id, i).E;
        double mass = particle_list->get_particle(event_id, i).mass;

        double rap_local;
        if (rap_type == 0) {
            double pmag = sqrt(E_local * E_local - mass * mass);
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local > rap_min && rap_local < rap_max) {
            double px_local = particle_list->get_particle(event_id, i).px;
            double py_local = particle_list->get_particle(event_id, i).py;
            double p_perp = sqrt(px_local * px_local + py_local * py_local);
            double p_phi = atan2(py_local, px_local);
            if (p_perp > pT_min_selected && p_perp < pT_max_selected) {
                event_Qn_real[0] += 1;
                event_Qn_real_err[0] += 1;
                event_Qn_imag[0] += p_perp;
                event_Qn_imag_err[0] += p_perp * p_perp;
                for (int iorder = 1; iorder < order_max; iorder++) {
                    double cos_nphi = cos(iorder * p_phi);
                    double sin_nphi = sin(iorder * p_phi);
                    event_Qn_real[iorder] += cos_nphi;
                    event_Qn_imag[iorder] += sin_nphi;
                    event_Qn_real_err[iorder] += cos_nphi * cos_nphi;
                    event_Qn_imag_err[iorder] += sin_nphi * sin_nphi;
                }

                if (p_perp < pT_min) continue;

                int p_idx = static_cast<int>((p_perp - pT_min) / dpT);
                if (p_idx < 0 || p_idx >= npT) continue;

                event_pT_mean[p_idx] += p_perp;
                event_pT_mean_err[p_idx] += p_perp * p_perp;
                for (int iorder = 0; iorder < order_max; iorder++) {
                    double cos_nphi = cos(iorder * p_phi);
                    double sin_nphi = sin(iorder * p_phi);
                    event_Qn_diff_real[iorder][p_idx] += cos_nphi;
                    event_Qn_diff_real_err[iorder][p_idx] +=
                        cos_nphi * cos_nphi;
                    event_Qn_diff_imag[iorder][p_idx] += sin_nphi;
                    event_Qn_diff_imag_err[iorder][p_idx] +=
                        sin_nphi * sin_nphi;
                }
            }
        }
    }
}